

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

void advanceStream(int nStream,long nCalls,int bUse64Bit)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  undefined4 unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_EDX == 0) {
    NthElement(CONCAT44(bUse64Bit,unaff_retaddr),(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8))
    ;
  }
  else {
    lVar1 = AdvanceRand64(Seed[in_EDI].value,in_RSI);
    Seed[in_EDI].value = lVar1;
  }
  Seed[in_EDI].nCalls = in_RSI + Seed[in_EDI].nCalls;
  return;
}

Assistant:

void 
advanceStream(int nStream, DSS_HUGE nCalls, int bUse64Bit)
{
   if (bUse64Bit)
      Seed[nStream].value = AdvanceRand64(Seed[nStream].value, nCalls);
   else
      NthElement(nCalls, &Seed[nStream].value);

#ifdef RNG_TEST
   Seed[nStream].nCalls += nCalls;
#endif

	return;
}